

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O2

void __thiscall
chrono::collision::BoxBoxCollisionTest2::ClosestPointsBetweenLines::operator()
          (ClosestPointsBetweenLines *this,Vector *pA,Vector *uA,Vector *pB,Vector *uB,double *s,
          double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 extraout_var [56];
  
  dVar1 = pB->m_data[0];
  dVar2 = pB->m_data[1];
  dVar3 = pA->m_data[0];
  dVar4 = pA->m_data[1];
  dVar5 = pB->m_data[2];
  dVar6 = pA->m_data[2];
  auVar12._0_8_ = ChVector<double>::Dot(uA,uB);
  auVar12._8_56_ = extraout_var;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uA->m_data[0];
  dVar7 = uA->m_data[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uA->m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uB->m_data[0];
  dVar8 = uB->m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uB->m_data[2];
  *s = 0.0;
  *t = 0.0;
  auVar11 = auVar12._0_16_;
  auVar9 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar11,auVar11);
  auVar10._8_8_ = 0x7fffffffffffffff;
  auVar10._0_8_ = 0x7fffffffffffffff;
  auVar10 = vandpd_avx512vl(auVar9,auVar10);
  if (1e-06 < auVar10._0_8_) {
    dVar2 = dVar2 - dVar4;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar2 * dVar8;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar1 - dVar3;
    auVar10 = vfmadd213sd_fma(auVar17,auVar20,auVar18);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar2 * dVar7;
    auVar15 = vfmadd213sd_fma(auVar15,auVar20,auVar16);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar5 - dVar6;
    auVar10 = vfmadd213sd_fma(auVar14,auVar19,auVar10);
    auVar13 = vfmadd213sd_fma(auVar13,auVar19,auVar15);
    auVar14 = vfnmadd213sd_fma(auVar10,auVar11,auVar13);
    auVar10 = vfmsub213sd_fma(auVar13,auVar11,auVar10);
    *s = auVar14._0_8_ / auVar9._0_8_;
    *t = auVar10._0_8_ / auVar9._0_8_;
  }
  return;
}

Assistant:

void operator()(Vector& pA, Vector& uA, Vector& pB, Vector& uB, double& s, double& t) {
            Vector r = pB - pA;
            double k = uA.Dot(uB);
            double q1 = uA.Dot(r);
            double q2 = -uB.Dot(r);
            double w = 1 - k * k;
            s = 0;
            t = 0;
            if (fabs(w) > COLL_PRECISION) {
                s = (q1 + k * q2) / w;
                t = (q2 + k * q1) / w;
            }
        }